

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphEdit.cpp
# Opt level: O2

void __thiscall GraphEdit::calculateCellHeight(GraphEdit *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  
  iVar1 = availableHeight(this);
  iVar2 = this->mMaxValue + 1;
  iVar5 = iVar2 - this->mMinValue;
  iVar3 = -iVar5;
  if (0 < iVar5) {
    iVar3 = iVar5;
  }
  if (iVar2 != this->mMinValue) {
    iVar2 = iVar1 / iVar3;
    if (this->mBarMode == true) {
      iVar3 = QAbstractScrollArea::verticalScrollBar();
      QAbstractSlider::setRange(iVar3,0);
    }
    else if (iVar2 < 8) {
      iVar2 = 8;
      iVar3 = QAbstractScrollArea::verticalScrollBar();
      QAbstractSlider::value();
      QAbstractSlider::pageStep();
      QAbstractSlider::setPageStep(iVar3);
      QAbstractSlider::setRange(iVar3,this->mMinValue);
      QAbstractSlider::setValue(iVar3);
      iVar1 = iVar1 / 8 << 3;
    }
    else {
      iVar1 = QAbstractScrollArea::verticalScrollBar();
      QAbstractSlider::setRange(iVar1,0);
      iVar1 = iVar2 * iVar3;
    }
    lVar4 = QAbstractScrollArea::viewport();
    iVar3 = ((*(int *)(*(long *)(lVar4 + 0x20) + 0x20) -
             (*(int *)(*(long *)(lVar4 + 0x20) + 0x18) + iVar1)) + 1) / 2;
    (this->mPlotRect).y1 = iVar3;
    (this->mPlotRect).y2 = iVar3 + iVar1 + -1;
    this->mCellHeight = iVar2 + (uint)(iVar2 == 0);
  }
  return;
}

Assistant:

void GraphEdit::calculateCellHeight() {
    auto const _height = availableHeight();

    auto range = abs(mMaxValue + 1 - mMinValue);
    if (range) {
        int newHeight;
        auto cellHeight = _height / range;
        if (mBarMode) {
            verticalScrollBar()->setRange(0, 0);
            newHeight = _height;
        } else {
            if (cellHeight < TU::MIN_CELL_HEIGHT) {
                cellHeight = TU::MIN_CELL_HEIGHT;
                // idk why the -1 is needed but it works
                auto pagestep = (_height / TU::MIN_CELL_HEIGHT) - 1;
                auto scrollbar = verticalScrollBar();

                // keep the current value proportional to the new range
                auto value = scrollbar->value() + (scrollbar->pageStep() + 1) / 2 - (pagestep + 1) / 2;

                scrollbar->setPageStep(pagestep);
                scrollbar->setRange(mMinValue, mMaxValue - pagestep);
                scrollbar->setValue(value);
                newHeight = (pagestep + 1) * TU::MIN_CELL_HEIGHT;
            } else {
                verticalScrollBar()->setRange(0, 0);
                newHeight = cellHeight * range;
            }
        }
        
        mPlotRect.setTop((viewport()->height() - newHeight) / 2);
        mPlotRect.setHeight(newHeight);
        
        if (cellHeight == 0) {
            cellHeight = 1;
        }
        mCellHeight = cellHeight;
    }
}